

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

LiteralNull * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1)

{
  LiteralNull *open_fodder;
  LiteralNull *r;
  LocationRange *in_stack_ffffffffffffffc8;
  LiteralNull *in_stack_ffffffffffffffd0;
  
  open_fodder = (LiteralNull *)operator_new(0x80);
  LiteralNull::LiteralNull
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(Fodder *)open_fodder);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             in_stack_ffffffffffffffd0,(value_type *)open_fodder);
  return open_fodder;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }